

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

ProcNodeConstruct jx9GetNodeHandler(sxu32 nNodeType)

{
  code *pcStack_10;
  sxu32 nNodeType_local;
  
  if ((nNodeType & 3) == 0) {
    if ((nNodeType & 0x2000) == 0) {
      if ((nNodeType & 0x4000) == 0) {
        if ((nNodeType & 0x10000) == 0) {
          pcStack_10 = (ProcNodeConstruct)0x0;
        }
        else {
          pcStack_10 = jx9CompileNowdoc;
        }
      }
      else {
        pcStack_10 = jx9CompileSimpleString;
      }
    }
    else {
      pcStack_10 = jx9CompileString;
    }
  }
  else {
    pcStack_10 = jx9CompileNumLiteral;
  }
  return pcStack_10;
}

Assistant:

JX9_PRIVATE ProcNodeConstruct jx9GetNodeHandler(sxu32 nNodeType)
{
	if( nNodeType & JX9_TK_NUM ){
		/* Numeric literal: Either real or integer */
		return jx9CompileNumLiteral;
	}else if( nNodeType & JX9_TK_DSTR ){
		/* Double quoted string */
		return jx9CompileString;
	}else if( nNodeType & JX9_TK_SSTR ){
		/* Single quoted string */
		return jx9CompileSimpleString;
	}else if( nNodeType & JX9_TK_NOWDOC ){
		/* Nowdoc */
		return jx9CompileNowdoc;
	}
	return 0;
}